

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int load_obj(em8051 *aCPU,char *aFilename)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  bool bVar5;
  int local_3c;
  int data;
  int i;
  int checksum;
  int recordtype;
  int address;
  int recordlength;
  FILE *f;
  char *aFilename_local;
  em8051 *aCPU_local;
  
  if ((aFilename == (char *)0x0) || (*aFilename == '\0')) {
    aCPU_local._4_4_ = -1;
  }
  else {
    __stream = fopen(aFilename,"r");
    if (__stream == (FILE *)0x0) {
      aCPU_local._4_4_ = -1;
    }
    else {
      iVar1 = fgetc(__stream);
      if (iVar1 == 0x3a) {
        while (iVar1 = feof(__stream), iVar1 == 0) {
          iVar1 = readbyte((FILE *)__stream);
          iVar2 = readbyte((FILE *)__stream);
          uVar3 = readbyte((FILE *)__stream);
          uVar4 = uVar3 | iVar2 << 8;
          iVar2 = readbyte((FILE *)__stream);
          if (iVar2 == 1) {
            return 0;
          }
          if (iVar2 != 0) {
            return -3;
          }
          data = iVar1 + (uVar3 & 0xff) + ((int)uVar4 >> 8);
          for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
            iVar2 = readbyte((FILE *)__stream);
            data = iVar2 + data;
            aCPU->mCodeMem[(int)(uVar4 + local_3c)] = (uchar)iVar2;
          }
          uVar3 = readbyte((FILE *)__stream);
          if (uVar3 != (0x100 - (data & 0xffU) & 0xff)) {
            return -4;
          }
          do {
            iVar1 = fgetc(__stream);
            bVar5 = false;
            if (iVar1 != 0x3a) {
              iVar1 = feof(__stream);
              bVar5 = iVar1 == 0;
            }
          } while (bVar5);
        }
        fclose(__stream);
        aCPU_local._4_4_ = -5;
      }
      else {
        fclose(__stream);
        aCPU_local._4_4_ = -2;
      }
    }
  }
  return aCPU_local._4_4_;
}

Assistant:

int load_obj(struct em8051 *aCPU, char *aFilename)
{
    FILE *f;    
    if (aFilename == 0 || aFilename[0] == 0)
        return -1;
    f = fopen(aFilename, "r");
    if (!f) return -1;
    if (fgetc(f) != ':')
    {
    	  fclose(f);
        return -2; // unsupported file format
    }
    while (!feof(f))
    {
        int recordlength;
        int address;
        int recordtype;
        int checksum;
        int i;
        recordlength = readbyte(f);
        address = readbyte(f);
        address <<= 8;
        address |= readbyte(f);
        recordtype = readbyte(f);
        if (recordtype == 1)
            return 0; // we're done
        if (recordtype != 0)
            return -3; // unsupported record type
        checksum = recordtype + recordlength + (address & 0xff) + (address >> 8); // final checksum = 1 + not(checksum)
        for (i = 0; i < recordlength; i++)
        {
            int data = readbyte(f);
            checksum += data;
            aCPU->mCodeMem[address + i] = data;
        }
        i = readbyte(f);
        checksum &= 0xff;
        checksum = 256 - checksum;
        if (i != (checksum & 0xff))
            return -4; // checksum failure
        while (fgetc(f) != ':' && !feof(f)) {} // skip newline        
    }
	  fclose(f);
    return -5;
}